

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall
Hospital::Validate_Nurse_To_Enter
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  ostream *this_00;
  string *this_01;
  __type local_c9;
  string username_1;
  undefined1 local_78 [64];
  int local_38;
  int local_34;
  int i;
  int cntr;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  string *password_local;
  string *username_local;
  Hospital *this_local;
  
  local_34 = 0;
  local_38 = 0;
  _i = All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)password;
  password_local = username;
  username_local = &this->Admin_Username;
  do {
    uVar2 = (ulong)local_38;
    sVar3 = std::vector<Nurse,_std::allocator<Nurse>_>::size(All_Of_Nurses);
    if (sVar3 <= uVar2) {
LAB_00123848:
      if (local_34 == 0) {
        this_00 = std::operator<<((ostream *)&std::cout,"your username or password is incorrect .");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        return false;
      }
      this_01 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(this_01,(string *)username);
      __cxa_throw(this_01,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::vector<Nurse,_std::allocator<Nurse>_>::operator[](All_Of_Nurses,(long)local_38);
    Human::User_name_Getter_abi_cxx11_((Human *)(local_78 + 0x20));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_78 + 0x20),username);
    local_c9 = false;
    if (_Var1) {
      std::vector<Nurse,_std::allocator<Nurse>_>::operator[](All_Of_Nurses,(long)local_38);
      Human::Password_Getter_abi_cxx11_((Human *)local_78);
      local_c9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78,password);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::__cxx11::string::~string((string *)(local_78 + 0x20));
    if (local_c9 != false) {
      local_34 = local_34 + 1;
      goto LAB_00123848;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool Hospital :: Validate_Nurse_To_Enter (string username , string password , vector<Nurse> All_Of_Nurses){
    int cntr = 0;

    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            cntr++;
            break;
        }
    }

    try {
        if (cntr == 0) {
            cout << "your username or password is incorrect ." << endl;
            return false;
        } else throw username;
    }
    catch (string username) {
        cout << "you entered successfully ." << endl;
        return true;
    }
}